

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O0

bool deqp::gls::edgeRelaxedImageCompare
               (TestLog *log,char *imageSetName,char *imageSetDesc,Surface *reference,
               Surface *result,IVec3 *compareThreshold,IVec3 *renderTargetThreshold,
               int maxAllowedInvalidPixels)

{
  void **this;
  bool bVar1;
  MessageBuilder *pMVar2;
  TestLog *pTVar3;
  bool local_9b4;
  bool local_9b2;
  allocator<char> local_989;
  string local_988;
  allocator<char> local_961;
  string local_960;
  LogImage local_940;
  allocator<char> local_8a9;
  string local_8a8;
  allocator<char> local_881;
  string local_880;
  LogImageSet local_860;
  undefined4 local_81c;
  ConstPixelBufferAccess local_818;
  allocator<char> local_7e9;
  string local_7e8;
  allocator<char> local_7c1;
  string local_7c0;
  LogImage local_7a0;
  allocator<char> local_709;
  string local_708;
  allocator<char> local_6e1;
  string local_6e0;
  LogImage local_6c0;
  allocator<char> local_629;
  string local_628;
  allocator<char> local_601;
  string local_600;
  LogImage local_5e0;
  allocator<char> local_549;
  string local_548;
  allocator<char> local_521;
  string local_520;
  LogImageSet local_500;
  int local_4bc;
  int local_4b8;
  int local_4b4;
  MessageBuilder local_4b0;
  MessageBuilder local_330;
  Vector<unsigned_int,_4> local_1b0;
  deUint32 local_1a0;
  undefined1 local_19c;
  byte local_19b;
  byte local_19a;
  byte local_199;
  deUint32 grayscaleValue_1;
  bool isOkScreenCoverage;
  bool isOkReferenceCoverage;
  bool screenCoverage;
  bool referenceCoverage;
  deUint32 local_188;
  bool local_183;
  bool local_182;
  byte local_181;
  deUint32 grayscaleValue;
  bool isOkScreenPixel;
  bool isOkReferencePixel;
  RGBA RStack_17c;
  bool directMatch;
  RGBA screenPixel;
  RGBA refPixel;
  int x;
  int y;
  PixelBufferAccess local_148;
  PixelBufferAccess local_120;
  PixelBufferAccess local_f8;
  int local_d0 [2];
  int numFailingPixels;
  undefined1 local_c0 [8];
  PixelBufferAccess errorAccess;
  undefined1 local_90 [8];
  TextureLevel errorMask;
  int height;
  int width;
  IVec4 red;
  IVec4 green;
  IVec3 *compareThreshold_local;
  Surface *result_local;
  Surface *reference_local;
  char *imageSetDesc_local;
  char *imageSetName_local;
  TestLog *log_local;
  
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)(red.m_data + 2),0,0xff,0,0xff);
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&height,0xff,0,0,0xff);
  errorMask.m_data.m_cap._4_4_ = tcu::Surface::getWidth(reference);
  errorMask.m_data.m_cap._0_4_ = tcu::Surface::getHeight(reference);
  this = &errorAccess.super_ConstPixelBufferAccess.m_data;
  tcu::TextureFormat::TextureFormat((TextureFormat *)this,RGB,UNORM_INT8);
  tcu::TextureLevel::TextureLevel
            ((TextureLevel *)local_90,(TextureFormat *)this,errorMask.m_data.m_cap._4_4_,
             (int)errorMask.m_data.m_cap,1);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)local_c0,(TextureLevel *)local_90);
  local_d0[0] = 0;
  tcu::getSubregion(&local_f8,(PixelBufferAccess *)local_c0,0,0,errorMask.m_data.m_cap._4_4_,1);
  tcu::clear(&local_f8,(IVec4 *)(red.m_data + 2));
  tcu::getSubregion(&local_120,(PixelBufferAccess *)local_c0,0,(int)errorMask.m_data.m_cap + -1,
                    errorMask.m_data.m_cap._4_4_,1);
  tcu::clear(&local_120,(IVec4 *)(red.m_data + 2));
  tcu::getSubregion(&local_148,(PixelBufferAccess *)local_c0,0,0,1,(int)errorMask.m_data.m_cap);
  tcu::clear(&local_148,(IVec4 *)(red.m_data + 2));
  tcu::getSubregion((PixelBufferAccess *)&x,(PixelBufferAccess *)local_c0,
                    errorMask.m_data.m_cap._4_4_ + -1,0,1,(int)errorMask.m_data.m_cap);
  tcu::clear((PixelBufferAccess *)&x,(IVec4 *)(red.m_data + 2));
  for (refPixel.m_value = 1; (int)refPixel.m_value < (int)errorMask.m_data.m_cap + -1;
      refPixel.m_value = refPixel.m_value + 1) {
    for (screenPixel.m_value = 1; (int)screenPixel.m_value < errorMask.m_data.m_cap._4_4_ + -1;
        screenPixel.m_value = screenPixel.m_value + 1) {
      RStack_17c = tcu::Surface::getPixel(reference,screenPixel.m_value,refPixel.m_value);
      grayscaleValue = (deUint32)tcu::Surface::getPixel(result,screenPixel.m_value,refPixel.m_value)
      ;
      local_181 = colorsEqual(&stack0xfffffffffffffe84,(RGBA *)&grayscaleValue,compareThreshold);
      local_9b2 = true;
      if (!(bool)local_181) {
        local_9b2 = pixelNeighborhoodContainsColor
                              (result,screenPixel.m_value,refPixel.m_value,&stack0xfffffffffffffe84,
                               compareThreshold);
      }
      local_182 = local_9b2;
      local_9b4 = true;
      if ((local_181 & 1) == 0) {
        local_9b4 = pixelNeighborhoodContainsColor
                              (reference,screenPixel.m_value,refPixel.m_value,
                               (RGBA *)&grayscaleValue,compareThreshold);
      }
      local_183 = local_9b4;
      if ((local_9b4 == false) || ((local_182 & 1U) == 0)) {
        bVar1 = pixelNearEdge(screenPixel.m_value,refPixel.m_value,reference,renderTargetThreshold);
        if (bVar1) {
          bVar1 = isBlack(&stack0xfffffffffffffe84);
          local_199 = !bVar1;
          bVar1 = isBlack((RGBA *)&grayscaleValue);
          local_19a = !bVar1;
          local_19b = pixelNeighborhoodContainsCoverage
                                (result,screenPixel.m_value,refPixel.m_value,(bool)(local_199 & 1));
          local_19c = pixelNeighborhoodContainsCoverage
                                (reference,screenPixel.m_value,refPixel.m_value,
                                 (bool)(local_19a & 1));
          if (((bool)local_19c) && ((local_19b & 1) != 0)) {
            local_1a0 = getVisualizationGrayscaleColor((RGBA *)&grayscaleValue);
            tcu::Vector<unsigned_int,_4>::Vector(&local_1b0,local_1a0,0xff,local_1a0,0xff);
            tcu::PixelBufferAccess::setPixel
                      ((PixelBufferAccess *)local_c0,&local_1b0,screenPixel.m_value,refPixel.m_value
                       ,0);
          }
          else {
            tcu::PixelBufferAccess::setPixel
                      ((PixelBufferAccess *)local_c0,(IVec4 *)&height,screenPixel.m_value,
                       refPixel.m_value,0);
            local_d0[0] = local_d0[0] + 1;
          }
        }
        else {
          tcu::PixelBufferAccess::setPixel
                    ((PixelBufferAccess *)local_c0,(IVec4 *)&height,screenPixel.m_value,
                     refPixel.m_value,0);
          local_d0[0] = local_d0[0] + 1;
        }
      }
      else {
        local_188 = getVisualizationGrayscaleColor((RGBA *)&grayscaleValue);
        tcu::Vector<unsigned_int,_4>::Vector
                  ((Vector<unsigned_int,_4> *)&grayscaleValue_1,local_188,0xff,local_188,0xff);
        tcu::PixelBufferAccess::setPixel
                  ((PixelBufferAccess *)local_c0,(UVec4 *)&grayscaleValue_1,screenPixel.m_value,
                   refPixel.m_value,0);
      }
    }
  }
  tcu::TestLog::operator<<(&local_330,log,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<(&local_330,(char (*) [19])"Comparing images:\n");
  pMVar2 = tcu::MessageBuilder::operator<<
                     (pMVar2,(char (*) [43])"\tallowed deviation in pixel positions = 1\n");
  pMVar2 = tcu::MessageBuilder::operator<<
                     (pMVar2,(char (*) [37])"\tnumber of allowed invalid pixels = ");
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&maxAllowedInvalidPixels);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [2])0xf12600);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [29])"\tnumber of invalid pixels = ");
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,local_d0);
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_330);
  bVar1 = local_d0[0] <= maxAllowedInvalidPixels;
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_880,imageSetName,&local_881)
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_8a8,imageSetDesc,&local_8a9)
    ;
    tcu::LogImageSet::LogImageSet(&local_860,&local_880,&local_8a8);
    pTVar3 = tcu::TestLog::operator<<(log,&local_860);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_960,"Result",&local_961);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_988,"Result",&local_989);
    tcu::LogImage::LogImage(&local_940,&local_960,&local_988,result,QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar3 = tcu::TestLog::operator<<(pTVar3,&local_940);
    tcu::TestLog::operator<<(pTVar3,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
    tcu::LogImage::~LogImage(&local_940);
    std::__cxx11::string::~string((string *)&local_988);
    std::allocator<char>::~allocator(&local_989);
    std::__cxx11::string::~string((string *)&local_960);
    std::allocator<char>::~allocator(&local_961);
    tcu::LogImageSet::~LogImageSet(&local_860);
    std::__cxx11::string::~string((string *)&local_8a8);
    std::allocator<char>::~allocator(&local_8a9);
    std::__cxx11::string::~string((string *)&local_880);
    std::allocator<char>::~allocator(&local_881);
  }
  else {
    tcu::TestLog::operator<<(&local_4b0,log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar2 = tcu::MessageBuilder::operator<<
                       (&local_4b0,(char (*) [45])"Image comparison failed. Color threshold = (");
    local_4b4 = tcu::Vector<int,_3>::x(compareThreshold);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_4b4);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [3])0xf95514);
    local_4b8 = tcu::Vector<int,_3>::y(compareThreshold);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_4b8);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [3])0xf95514);
    local_4bc = tcu::Vector<int,_3>::z(compareThreshold);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_4bc);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [2])0xf2e642);
    pTVar3 = tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_520,imageSetName,&local_521)
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_548,imageSetDesc,&local_549)
    ;
    tcu::LogImageSet::LogImageSet(&local_500,&local_520,&local_548);
    pTVar3 = tcu::TestLog::operator<<(pTVar3,&local_500);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_600,"Result",&local_601);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_628,"Result",&local_629);
    tcu::LogImage::LogImage(&local_5e0,&local_600,&local_628,result,QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar3 = tcu::TestLog::operator<<(pTVar3,&local_5e0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_6e0,"Reference",&local_6e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_708,"Reference",&local_709);
    tcu::LogImage::LogImage
              (&local_6c0,&local_6e0,&local_708,reference,QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar3 = tcu::TestLog::operator<<(pTVar3,&local_6c0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_7c0,"ErrorMask",&local_7c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_7e8,"Error mask",&local_7e9)
    ;
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_818,(TextureLevel *)local_90);
    tcu::LogImage::LogImage
              (&local_7a0,&local_7c0,&local_7e8,&local_818,QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar3 = tcu::TestLog::operator<<(pTVar3,&local_7a0);
    tcu::TestLog::operator<<(pTVar3,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
    tcu::LogImage::~LogImage(&local_7a0);
    std::__cxx11::string::~string((string *)&local_7e8);
    std::allocator<char>::~allocator(&local_7e9);
    std::__cxx11::string::~string((string *)&local_7c0);
    std::allocator<char>::~allocator(&local_7c1);
    tcu::LogImage::~LogImage(&local_6c0);
    std::__cxx11::string::~string((string *)&local_708);
    std::allocator<char>::~allocator(&local_709);
    std::__cxx11::string::~string((string *)&local_6e0);
    std::allocator<char>::~allocator(&local_6e1);
    tcu::LogImage::~LogImage(&local_5e0);
    std::__cxx11::string::~string((string *)&local_628);
    std::allocator<char>::~allocator(&local_629);
    std::__cxx11::string::~string((string *)&local_600);
    std::allocator<char>::~allocator(&local_601);
    tcu::LogImageSet::~LogImageSet(&local_500);
    std::__cxx11::string::~string((string *)&local_548);
    std::allocator<char>::~allocator(&local_549);
    std::__cxx11::string::~string((string *)&local_520);
    std::allocator<char>::~allocator(&local_521);
    tcu::MessageBuilder::~MessageBuilder(&local_4b0);
  }
  local_81c = 1;
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_90);
  return bVar1;
}

Assistant:

static bool edgeRelaxedImageCompare (tcu::TestLog& log, const char* imageSetName, const char* imageSetDesc, const tcu::Surface& reference, const tcu::Surface& result, const tcu::IVec3& compareThreshold, const tcu::IVec3& renderTargetThreshold, int maxAllowedInvalidPixels)
{
	DE_ASSERT(result.getWidth() == reference.getWidth() && result.getHeight() == reference.getHeight());

	const tcu::IVec4				green						(0, 255, 0, 255);
	const tcu::IVec4				red							(255, 0, 0, 255);
	const int						width						= reference.getWidth();
	const int						height						= reference.getHeight();
	tcu::TextureLevel				errorMask					(tcu::TextureFormat(tcu::TextureFormat::RGB, tcu::TextureFormat::UNORM_INT8), width, height);
	const tcu::PixelBufferAccess	errorAccess					= errorMask.getAccess();
	int								numFailingPixels			= 0;

	// clear errormask edges which would otherwise be transparent

	tcu::clear(tcu::getSubregion(errorAccess, 0,			0,			width,	1),			green);
	tcu::clear(tcu::getSubregion(errorAccess, 0,			height-1,	width,	1),			green);
	tcu::clear(tcu::getSubregion(errorAccess, 0,			0,			1,		height),	green);
	tcu::clear(tcu::getSubregion(errorAccess, width-1,		0,			1,		height),	green);

	// skip edge pixels since coverage on edge cannot be verified

	for (int y = 1; y < height - 1; ++y)
	for (int x = 1; x < width - 1; ++x)
	{
		const tcu::RGBA	refPixel			= reference.getPixel(x, y);
		const tcu::RGBA	screenPixel			= result.getPixel(x, y);
		const bool		directMatch			= colorsEqual(refPixel, screenPixel, compareThreshold);
		const bool		isOkReferencePixel	= directMatch || pixelNeighborhoodContainsColor(result, x, y, refPixel, compareThreshold);			// screen image has a matching pixel nearby (~= If something is drawn on reference, it must be drawn to screen too.)
		const bool		isOkScreenPixel		= directMatch || pixelNeighborhoodContainsColor(reference, x, y, screenPixel, compareThreshold);	// reference image has a matching pixel nearby (~= If something is drawn on screen, it must be drawn to reference too.)

		if (isOkScreenPixel && isOkReferencePixel)
		{
			// pixel valid, write greenish pixels to make the result image easier to read
			const deUint32 grayscaleValue = getVisualizationGrayscaleColor(screenPixel);
			errorAccess.setPixel(tcu::UVec4(grayscaleValue, 255, grayscaleValue, 255), x, y);
		}
		else if (!pixelNearEdge(x, y, reference, renderTargetThreshold))
		{
			// non-edge pixel values must be within threshold of the reference values
			errorAccess.setPixel(red, x, y);
			++numFailingPixels;
		}
		else
		{
			// we are on/near an edge, verify only coverage (coverage == not background colored)
			const bool	referenceCoverage		= !isBlack(refPixel);
			const bool	screenCoverage			= !isBlack(screenPixel);
			const bool	isOkReferenceCoverage	= pixelNeighborhoodContainsCoverage(result, x, y, referenceCoverage);	// Check reference pixel against screen pixel
			const bool	isOkScreenCoverage		= pixelNeighborhoodContainsCoverage(reference, x, y, screenCoverage);	// Check screen pixels against reference pixel

			if (isOkScreenCoverage && isOkReferenceCoverage)
			{
				// pixel valid, write greenish pixels to make the result image easier to read
				const deUint32 grayscaleValue = getVisualizationGrayscaleColor(screenPixel);
				errorAccess.setPixel(tcu::UVec4(grayscaleValue, 255, grayscaleValue, 255), x, y);
			}
			else
			{
				// coverage does not match
				errorAccess.setPixel(red, x, y);
				++numFailingPixels;
			}
		}
	}

	log	<< TestLog::Message
		<< "Comparing images:\n"
		<< "\tallowed deviation in pixel positions = 1\n"
		<< "\tnumber of allowed invalid pixels = " << maxAllowedInvalidPixels << "\n"
		<< "\tnumber of invalid pixels = " << numFailingPixels
		<< TestLog::EndMessage;

	if (numFailingPixels > maxAllowedInvalidPixels)
	{
		log << TestLog::Message
			<< "Image comparison failed. Color threshold = (" << compareThreshold.x() << ", " << compareThreshold.y() << ", " << compareThreshold.z() << ")"
			<< TestLog::EndMessage
			<< TestLog::ImageSet(imageSetName, imageSetDesc)
			<< TestLog::Image("Result",		"Result",		result)
			<< TestLog::Image("Reference",	"Reference",	reference)
			<< TestLog::Image("ErrorMask",	"Error mask",	errorMask)
			<< TestLog::EndImageSet;

		return false;
	}
	else
	{
		log << TestLog::ImageSet(imageSetName, imageSetDesc)
			<< TestLog::Image("Result", "Result", result)
			<< TestLog::EndImageSet;

		return true;
	}
}